

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive-solver.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::
build_constraints<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
          (exhaustive_solver<baryonyx::itm::maximize_tag,long_double> *this,int k,
          vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
          *constraint_elements,int bk_min,int bk_max)

{
  exhaustive_solver<baryonyx::itm::maximize_tag,long_double> *this_00;
  pointer pfVar1;
  iterator __position;
  bool bVar2;
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  int j;
  ushort uVar12;
  undefined1 auVar14 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  int nb_solution;
  int start_it_flat_constraints;
  uint local_b8;
  uint local_b4;
  ulong local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *local_90;
  ulong local_88;
  exhaustive_solver<baryonyx::itm::maximize_tag,long_double> *local_80;
  undefined1 local_78 [64];
  undefined1 auVar13 [16];
  undefined1 auVar15 [32];
  
  uVar9 = (long)(constraint_elements->
                super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(constraint_elements->
                super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                )._M_impl.super__Vector_impl_data._M_start;
  local_b4 = 0;
  uVar8 = (ulong)(*(long *)(this + 0x20) - *(long *)(this + 0x18)) >> 2;
  local_a0 = (int)uVar8;
  local_a4 = bk_min;
  local_9c = bk_max;
  local_98 = bk_min;
  local_94 = k;
  local_90 = constraint_elements;
  if (k < 0) {
    build_constraints<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
              ();
  }
  else {
    uVar11 = (uint)(uVar9 >> 3);
    if (0 < (int)uVar11) {
      local_80 = this + 0x18;
      this_00 = this + 0x30;
      local_b8 = local_b8 & 0xffffff00;
      local_88 = uVar8;
      std::vector<signed_char,_std::allocator<signed_char>_>::resize
                ((vector<signed_char,_std::allocator<signed_char>_> *)this_00,(long)uVar9 >> 3,
                 (value_type_conflict *)&local_b8);
      auVar17 = vpbroadcastq_avx512f(ZEXT816(0x10));
      local_b0 = 0;
      auVar18 = vpbroadcastq_avx512f();
      local_78 = vmovdqu64_avx512f(auVar18);
      *(undefined1 *)(*(long *)(this + 0x38) + -1) = 1;
      lVar7 = *(long *)(this + 0x30);
      local_a8 = bk_max;
      do {
        lVar10 = (long)(*(int *)(this + 0x38) - (int)lVar7);
        while( true ) {
          auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          lVar7 = *(long *)this_00;
          auVar22 = ZEXT1664((undefined1  [16])0x0);
          uVar8 = 0;
          pfVar1 = (local_90->
                   super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          do {
            uVar3 = vpcmpuq_avx512f(auVar19,auVar18,2);
            bVar5 = (byte)uVar3;
            uVar3 = vpcmpuq_avx512f(auVar20,auVar18,2);
            bVar6 = (byte)uVar3;
            auVar21 = vmovdqa64_avx512f(auVar22);
            uVar12 = CONCAT11(bVar6,bVar5);
            auVar13 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(lVar7 + uVar8));
            auVar14[1] = ((byte)(uVar12 >> 1) & 1) * auVar13[1];
            auVar14[0] = (bVar5 & 1) * auVar13[0];
            auVar14[2] = ((byte)(uVar12 >> 2) & 1) * auVar13[2];
            auVar14[3] = ((byte)(uVar12 >> 3) & 1) * auVar13[3];
            auVar14[4] = ((byte)(uVar12 >> 4) & 1) * auVar13[4];
            auVar14[5] = ((byte)(uVar12 >> 5) & 1) * auVar13[5];
            auVar14[6] = ((byte)(uVar12 >> 6) & 1) * auVar13[6];
            auVar14[7] = ((byte)(uVar12 >> 7) & 1) * auVar13[7];
            auVar14[8] = (bVar6 & 1) * auVar13[8];
            auVar14[9] = (bVar6 >> 1 & 1) * auVar13[9];
            auVar14[10] = (bVar6 >> 2 & 1) * auVar13[10];
            auVar14[0xb] = (bVar6 >> 3 & 1) * auVar13[0xb];
            auVar14[0xc] = (bVar6 >> 4 & 1) * auVar13[0xc];
            auVar14[0xd] = (bVar6 >> 5 & 1) * auVar13[0xd];
            auVar14[0xe] = (bVar6 >> 6 & 1) * auVar13[0xe];
            auVar14[0xf] = -((char)bVar6 >> 7) * auVar13[0xf];
            uVar8 = uVar8 + 0x10;
            uVar3 = vptestmb_avx512vl(auVar14,auVar14);
            bVar4 = bVar6 & (byte)((ulong)uVar3 >> 8);
            auVar15 = vpgatherqd_avx512f(pfVar1[uVar8]);
            auVar16._4_4_ = (uint)(bVar4 >> 1 & 1) * auVar15._4_4_;
            auVar16._0_4_ = (uint)(bVar4 & 1) * auVar15._0_4_;
            auVar16._8_4_ = (uint)(bVar4 >> 2 & 1) * auVar15._8_4_;
            auVar16._12_4_ = (uint)(bVar4 >> 3 & 1) * auVar15._12_4_;
            auVar16._16_4_ = (uint)(bVar4 >> 4 & 1) * auVar15._16_4_;
            auVar16._20_4_ = (uint)(bVar4 >> 5 & 1) * auVar15._20_4_;
            auVar16._24_4_ = (uint)(bVar4 >> 6 & 1) * auVar15._24_4_;
            auVar16._28_4_ = (uint)(bVar4 >> 7) * auVar15._28_4_;
            bVar4 = bVar5 & (byte)uVar3;
            auVar20 = vpaddq_avx512f(auVar20,auVar17);
            auVar15 = vpgatherqd_avx512f(*(undefined8 *)((long)pfVar1 * 9));
            auVar19 = vpaddq_avx512f(auVar19,auVar17);
            auVar22 = vinserti64x4_avx512f
                                (ZEXT3264(CONCAT428((uint)(bVar4 >> 7) * auVar15._28_4_,
                                                    CONCAT424((uint)(bVar4 >> 6 & 1) *
                                                              auVar15._24_4_,
                                                              CONCAT420((uint)(bVar4 >> 5 & 1) *
                                                                        auVar15._20_4_,
                                                                        CONCAT416((uint)(bVar4 >> 4
                                                                                        & 1) *
                                                                                  auVar15._16_4_,
                                                                                  CONCAT412((uint)(
                                                  bVar4 >> 3 & 1) * auVar15._12_4_,
                                                  CONCAT48((uint)(bVar4 >> 2 & 1) * auVar15._8_4_,
                                                           CONCAT44((uint)(bVar4 >> 1 & 1) *
                                                                    auVar15._4_4_,
                                                                    (uint)(bVar4 & 1) *
                                                                    auVar15._0_4_)))))))),auVar16,1)
            ;
            auVar22 = vpaddd_avx512f(auVar21,auVar22);
          } while ((uVar11 + 0xf & 0xfffffff0) != uVar8);
          auVar19 = vmovdqa32_avx512f(auVar22);
          auVar20._0_4_ =
               (uint)(bVar5 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar21._0_4_;
          bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
          auVar20._4_4_ = (uint)bVar2 * auVar19._4_4_ | (uint)!bVar2 * auVar21._4_4_;
          bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
          auVar20._8_4_ = (uint)bVar2 * auVar19._8_4_ | (uint)!bVar2 * auVar21._8_4_;
          bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
          auVar20._12_4_ = (uint)bVar2 * auVar19._12_4_ | (uint)!bVar2 * auVar21._12_4_;
          bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
          auVar20._16_4_ = (uint)bVar2 * auVar19._16_4_ | (uint)!bVar2 * auVar21._16_4_;
          bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
          auVar20._20_4_ = (uint)bVar2 * auVar19._20_4_ | (uint)!bVar2 * auVar21._20_4_;
          bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
          auVar20._24_4_ = (uint)bVar2 * auVar19._24_4_ | (uint)!bVar2 * auVar21._24_4_;
          bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
          auVar20._28_4_ = (uint)bVar2 * auVar19._28_4_ | (uint)!bVar2 * auVar21._28_4_;
          auVar20._32_4_ =
               (uint)(bVar6 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar21._32_4_;
          bVar2 = (bool)(bVar6 >> 1 & 1);
          auVar20._36_4_ = (uint)bVar2 * auVar19._36_4_ | (uint)!bVar2 * auVar21._36_4_;
          bVar2 = (bool)(bVar6 >> 2 & 1);
          auVar20._40_4_ = (uint)bVar2 * auVar19._40_4_ | (uint)!bVar2 * auVar21._40_4_;
          bVar2 = (bool)(bVar6 >> 3 & 1);
          auVar20._44_4_ = (uint)bVar2 * auVar19._44_4_ | (uint)!bVar2 * auVar21._44_4_;
          bVar2 = (bool)(bVar6 >> 4 & 1);
          auVar20._48_4_ = (uint)bVar2 * auVar19._48_4_ | (uint)!bVar2 * auVar21._48_4_;
          bVar2 = (bool)(bVar6 >> 5 & 1);
          auVar20._52_4_ = (uint)bVar2 * auVar19._52_4_ | (uint)!bVar2 * auVar21._52_4_;
          bVar2 = (bool)(bVar6 >> 6 & 1);
          auVar20._56_4_ = (uint)bVar2 * auVar19._56_4_ | (uint)!bVar2 * auVar21._56_4_;
          auVar20._60_4_ =
               (uint)(bVar6 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar21._60_4_;
          auVar15 = vextracti64x4_avx512f(auVar20,1);
          auVar19 = vpaddd_avx512f(auVar20,ZEXT3264(auVar15));
          auVar13 = vpaddd_avx(auVar19._0_16_,auVar19._16_16_);
          auVar14 = vpshufd_avx(auVar13,0xee);
          auVar13 = vpaddd_avx(auVar13,auVar14);
          auVar14 = vpshufd_avx(auVar13,0x55);
          auVar13 = vpaddd_avx(auVar13,auVar14);
          if (auVar13._0_4_ <= bk_max && local_a4 <= auVar13._0_4_) {
            uVar8 = 0;
            local_b4 = (int)local_b0 + 1;
            local_b0 = (ulong)local_b4;
            do {
              if (*(char *)(*(long *)this_00 + uVar8) == '\0') {
                local_b8 = 0;
              }
              else {
                local_b8 = (local_90->
                           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar8].factor;
              }
              __position._M_current = *(int **)(this + 0x20);
              if (__position._M_current == *(int **)(this + 0x28)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)local_80,__position,(int *)&local_b8
                          );
                auVar17 = vpbroadcastq_avx512f(ZEXT816(0x10));
                auVar18 = vmovdqu64_avx512f(local_78);
              }
              else {
                *__position._M_current = local_b8;
                *(int **)(this + 0x20) = __position._M_current + 1;
              }
              uVar8 = uVar8 + 1;
            } while ((uVar11 & 0x7fffffff) != uVar8);
            lVar7 = *(long *)this_00;
            bk_max = local_a8;
          }
          lVar10 = lVar10 + -1;
          *(char *)(lVar7 + lVar10) = *(char *)(lVar7 + lVar10) + '\x01';
          lVar7 = *(long *)this_00;
          if (*(char *)(lVar7 + lVar10) < '\x02') break;
          *(undefined1 *)(lVar7 + lVar10) = 0;
          if (lVar10 == 0) {
            if ((int)local_88 < 0) goto LAB_005b2e2e;
            if (0 < (int)local_b0) {
              std::
              _Rb_tree<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::constraint,baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::constraint,std::_Identity<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::constraint>,std::less<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::constraint>,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::constraint>>
              ::_M_emplace_unique<int&,int_const&,int&,int&,int&>
                        ((_Rb_tree<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::constraint,baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::constraint,std::_Identity<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::constraint>,std::less<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::constraint>,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::constraint>>
                          *)(this + 0x48),&local_94,&local_a0,(int *)&local_b4,&local_98,&local_9c);
              return;
            }
            goto LAB_005b2e36;
          }
        }
      } while( true );
    }
  }
  build_constraints<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
            ();
LAB_005b2e2e:
  build_constraints<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
            ();
LAB_005b2e36:
  build_constraints<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
            ();
}

Assistant:

void build_constraints(int k,
                           const C& constraint_elements,
                           int bk_min,
                           int bk_max)
    {
        const auto constraint_size = length(constraint_elements);
        const auto start_it_flat_constraints = length(flat_constraints);
        auto nb_solution = 0;

        bx_ensures(k >= 0);
        bx_ensures(constraint_size > 0);

        walkers.resize(constraint_elements.size(), 0);
        walkers.back() = 1;
        bool end = false;

        do {
            auto i = length(walkers) - 1;

            do {
                int sum = 0;
                for (int j = 0; j != constraint_size; ++j)
                    if (walkers[j])
                        sum += constraint_elements[j].factor;

                if (bk_min <= sum && sum <= bk_max) {
                    ++nb_solution;
                    for (int j = 0; j != constraint_size; ++j) {
                        flat_constraints.emplace_back(
                          walkers[j] ? constraint_elements[j].factor : 0);
                    }
                }

                ++walkers[i];

                if (walkers[i] > 1) {
                    walkers[i] = 0;

                    if (i == 0) {
                        end = true;
                        break;
                    } else {
                        --i;
                    }
                } else {
                    break;
                }
            } while (!end);
        } while (!end);

        bx_expects(start_it_flat_constraints >= 0);
        bx_expects(nb_solution > 0);

        constraints.emplace(
          k, start_it_flat_constraints, nb_solution, bk_min, bk_max);
    }